

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  Branch *pBVar2;
  char *__dest;
  char *pcVar3;
  String local_48;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar3 = (this->text).content.ptr + params->size_ + params_2->size_ + params_1->size_;
  __return_storage_ptr__->size_ = (size_t)pcVar3;
  heapString(&local_48,(size_t)pcVar3);
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  pBVar2 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                               ::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  pcVar3 = (this->text).content.ptr;
  (__return_storage_ptr__->branches).ptr = pBVar2;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __dest = local_48.content.ptr;
  if (local_48.content.size_ == 0) {
    __dest = (char *)0x0;
  }
  if (pcVar3 != (char *)0x0) {
    memcpy(__dest,(void *)this->size_,(size_t)pcVar3);
    __dest = __dest + (long)pcVar3;
  }
  sVar1 = params->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params_1->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params_1->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  if (params_2->size_ != 0) {
    memcpy(__dest,params_2->ptr,params_2->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}